

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O2

raw_ostream * __thiscall llvm::raw_ostream::write_zeros(raw_ostream *this,uint NumZeros)

{
  size_t in_RCX;
  void *__buf;
  
  if (NumZeros < 0x50) {
    write(this,0xe8bd60,(void *)(ulong)NumZeros,in_RCX);
  }
  else {
    for (; NumZeros != 0; NumZeros = NumZeros - (int)__buf) {
      __buf = (void *)0x4f;
      if (NumZeros < 0x4f) {
        __buf = (void *)(ulong)NumZeros;
      }
      write(this,0xe8bd60,__buf,in_RCX);
    }
  }
  return this;
}

Assistant:

raw_ostream &raw_ostream::write_zeros(unsigned NumZeros) {
  return write_padding<'\0'>(*this, NumZeros);
}